

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<ProKey,QMakeInternal::QMakeBuiltin>::emplace<QMakeInternal::QMakeBuiltin_const&>
          (QHash<ProKey,QMakeInternal::QMakeBuiltin> *this,ProKey *key,QMakeBuiltin *args)

{
  Data *pDVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QMakeBuiltin local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_50.usage.d.d = (Data *)0x0;
LAB_001ee908:
    QHash<ProKey,_QMakeInternal::QMakeBuiltin>::detach
              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)this);
    pVar3 = (piter)emplace_helper<QMakeInternal::QMakeBuiltin_const&>(this,key,args);
    QHash<ProKey,_QMakeInternal::QMakeBuiltin>::~QHash
              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)&local_50);
  }
  else {
    if (1 < (uint)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) {
      local_50.usage.d.d = pDVar1;
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_001ee908;
    }
    uVar2._0_4_ = pDVar1[1].super_QArrayData.ref_;
    uVar2._4_4_ = pDVar1[1].super_QArrayData.flags;
    if ((ulong)(pDVar1->super_QArrayData).alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar3 = (piter)emplace_helper<QMakeInternal::QMakeBuiltin_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_001ee97e;
    }
    QMakeInternal::QMakeBuiltin::QMakeBuiltin(&local_50,args);
    pVar3 = (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::
                   emplace_helper<QMakeInternal::QMakeBuiltin>
                             ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)this,key,&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
LAB_001ee97e:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }